

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndChild(void)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  ImVec2 sz;
  ImRect bb;
  ImRect local_28;
  
  pIVar2 = GImGui;
  if (GImGui->WithinEndChild != false) {
    __assert_fail("g.WithinEndChild == false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x12c8,"void ImGui::EndChild()");
  }
  pIVar1 = GImGui->CurrentWindow;
  if ((pIVar1->Flags & 0x1000000) != 0) {
    GImGui->WithinEndChild = true;
    if (pIVar1->BeginCount < 2) {
      sz = pIVar1->Size;
      fVar3 = sz.x;
      fVar4 = sz.y;
      if ((pIVar1->AutoFitChildAxises & 1U) != 0) {
        fVar5 = 4.0;
        if (4.0 <= fVar3) {
          fVar5 = fVar3;
        }
        fVar3 = fVar5;
        sz.y = fVar4;
        sz.x = fVar3;
      }
      fVar5 = fVar4;
      if ((pIVar1->AutoFitChildAxises & 2U) != 0) {
        fVar5 = 4.0;
        if (4.0 <= fVar4) {
          fVar5 = fVar4;
        }
        sz.y = fVar5;
      }
      End();
      bb.Min = (pIVar2->CurrentWindow->DC).CursorPos;
      bb.Max.y = fVar5 + bb.Min.y;
      bb.Max.x = fVar3 + bb.Min.x;
      ItemSize(&sz,-1.0);
      if ((((pIVar1->DC).NavLayerActiveMask == 0) && ((pIVar1->DC).NavHasScroll != true)) ||
         ((pIVar1->Flags & 0x800000) != 0)) {
        ItemAdd(&bb,0,(ImRect *)0x0);
      }
      else {
        ItemAdd(&bb,pIVar1->ChildId,(ImRect *)0x0);
        RenderNavHighlight(&bb,pIVar1->ChildId,1);
        if (((pIVar1->DC).NavLayerActiveMask == 0) && (pIVar1 == pIVar2->NavWindow)) {
          local_28.Min.x = bb.Min.x + -2.0;
          local_28.Min.y = bb.Min.y + -2.0;
          local_28.Max.x = bb.Max.x + 2.0;
          local_28.Max.y = bb.Max.y + 2.0;
          RenderNavHighlight(&local_28,pIVar2->NavId,2);
        }
      }
    }
    else {
      End();
    }
    pIVar2->WithinEndChild = false;
    return;
  }
  __assert_fail("window->Flags & ImGuiWindowFlags_ChildWindow",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x12c9,"void ImGui::EndChild()");
}

Assistant:

void ImGui::EndChild()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    IM_ASSERT(g.WithinEndChild == false);
    IM_ASSERT(window->Flags & ImGuiWindowFlags_ChildWindow);   // Mismatched BeginChild()/EndChild() calls

    g.WithinEndChild = true;
    if (window->BeginCount > 1)
    {
        End();
    }
    else
    {
        ImVec2 sz = window->Size;
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_X)) // Arbitrary minimum zero-ish child size of 4.0f causes less trouble than a 0.0f
            sz.x = ImMax(4.0f, sz.x);
        if (window->AutoFitChildAxises & (1 << ImGuiAxis_Y))
            sz.y = ImMax(4.0f, sz.y);
        End();

        ImGuiWindow* parent_window = g.CurrentWindow;
        ImRect bb(parent_window->DC.CursorPos, parent_window->DC.CursorPos + sz);
        ItemSize(sz);
        if ((window->DC.NavLayerActiveMask != 0 || window->DC.NavHasScroll) && !(window->Flags & ImGuiWindowFlags_NavFlattened))
        {
            ItemAdd(bb, window->ChildId);
            RenderNavHighlight(bb, window->ChildId);

            // When browsing a window that has no activable items (scroll only) we keep a highlight on the child
            if (window->DC.NavLayerActiveMask == 0 && window == g.NavWindow)
                RenderNavHighlight(ImRect(bb.Min - ImVec2(2,2), bb.Max + ImVec2(2,2)), g.NavId, ImGuiNavHighlightFlags_TypeThin);
        }
        else
        {
            // Not navigable into
            ItemAdd(bb, 0);
        }
    }
    g.WithinEndChild = false;
}